

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::
emplace_back<slang::ast::PortSymbol::NetTypeRange>
          (SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *this,NetTypeRange *args)

{
  bitwidth_t bVar1;
  undefined4 uVar2;
  pointer pNVar3;
  reference pNVar4;
  
  pNVar3 = this->data_ + this->len;
  if (this->len == this->cap) {
    pNVar3 = emplaceRealloc<slang::ast::PortSymbol::NetTypeRange>(this,pNVar3,args);
    return pNVar3;
  }
  bVar1 = args->width;
  uVar2 = *(undefined4 *)&args->field_0xc;
  pNVar3->netType = args->netType;
  pNVar3->width = bVar1;
  *(undefined4 *)&pNVar3->field_0xc = uVar2;
  this->len = this->len + 1;
  pNVar4 = back(this);
  return pNVar4;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }